

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator+=(ChebyshevExpansion *this,ChebyshevExpansion *donor)

{
  ulong size;
  ulong uVar1;
  ulong n;
  Type local_a0;
  Type local_68;
  
  size = (donor->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
  uVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  n = uVar1;
  if (size < uVar1) {
    n = size;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<unsigned_long>
            (&local_a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)donor,n);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<unsigned_long>
            (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,n);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_68,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
              *)&local_a0);
  if (uVar1 < size) {
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_true>
    ::run((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,size);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<unsigned_long>
              (&local_a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)donor,size - n);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<unsigned_long>
              (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,size - n);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &local_a0.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  }
  return this;
}

Assistant:

ChebyshevExpansion& ChebyshevExpansion::operator+=(const ChebyshevExpansion &donor) {
        std::size_t Ndonor = donor.coef().size(), N1 = m_c.size();
        std::size_t Nmin = std::min(N1, Ndonor), Nmax = std::max(N1, Ndonor);
        // The first Nmin terms overlap between the two vectors
        m_c.head(Nmin) += donor.coef().head(Nmin);
        // If the donor vector is longer than the current vector, resizing is needed
        if (Ndonor > N1) {
            // Resize but leave values as they were
            m_c.conservativeResize(Ndonor);
            // Copy the last Nmax-Nmin values from the donor
            m_c.tail(Nmax - Nmin) = donor.coef().tail(Nmax - Nmin);
        }
        return *this;
    }